

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile.c
# Opt level: O0

lysc_type_leafref * lys_type_leafref_next(lysc_node *node,uint64_t *index)

{
  lysc_node *plVar1;
  void *local_40;
  lysc_type *leaf_type;
  lysc_type_union *uni;
  lysc_type_leafref *ret;
  uint64_t *index_local;
  lysc_node *node_local;
  
  uni = (lysc_type_union *)0x0;
  if ((node->nodetype & 0xc) == 0) {
    __assert_fail("node->nodetype & LYD_NODE_TERM",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x440,
                  "struct lysc_type_leafref *lys_type_leafref_next(const struct lysc_node *, uint64_t *)"
                 );
  }
  plVar1 = node[1].parent;
  if (*(int *)&plVar1->next == 0xf) {
    while( true ) {
      if (plVar1->prev == (lysc_node *)0x0) {
        local_40 = (void *)0x0;
      }
      else {
        local_40 = plVar1->prev[-1].priv;
      }
      if (local_40 <= (void *)*index) {
        return (lysc_type_leafref *)0x0;
      }
      if (*(int *)(*(long *)(plVar1->prev->hash + *index * 8 + -4) + 0x18) == 0xe) break;
      *index = *index + 1;
    }
    uni = *(lysc_type_union **)(plVar1->prev->hash + *index * 8 + -4);
    *index = *index + 1;
  }
  else if ((*index == 0) &&
          (*index = *index + 1, uni = (lysc_type_union *)plVar1, *(int *)&plVar1->next != 0xe)) {
    __assert_fail("leaf_type->basetype == LY_TYPE_LEAFREF",
                  "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/schema_compile.c"
                  ,0x454,
                  "struct lysc_type_leafref *lys_type_leafref_next(const struct lysc_node *, uint64_t *)"
                 );
  }
  return (lysc_type_leafref *)uni;
}

Assistant:

static struct lysc_type_leafref *
lys_type_leafref_next(const struct lysc_node *node, LY_ARRAY_COUNT_TYPE *index)
{
    struct lysc_type_leafref *ret = NULL;
    struct lysc_type_union *uni;
    struct lysc_type *leaf_type;

    assert(node->nodetype & LYD_NODE_TERM);

    leaf_type = ((struct lysc_node_leaf *)node)->type;
    if (leaf_type->basetype == LY_TYPE_UNION) {
        uni = (struct lysc_type_union *)leaf_type;

        /* find next union leafref */
        while (*index < LY_ARRAY_COUNT(uni->types)) {
            if (uni->types[*index]->basetype == LY_TYPE_LEAFREF) {
                ret = (struct lysc_type_leafref *)uni->types[*index];
                ++(*index);
                break;
            }

            ++(*index);
        }
    } else {
        /* return just the single leafref */
        if (*index == 0) {
            ++(*index);
            assert(leaf_type->basetype == LY_TYPE_LEAFREF);
            ret = (struct lysc_type_leafref *)leaf_type;
        }
    }

    return ret;
}